

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void flatbuffers::SetAnyValueS(BaseType type,uint8_t *data,char *val)

{
  int64_t val_00;
  double local_28;
  double d;
  char *val_local;
  uint8_t *data_local;
  BaseType type_local;
  
  d = (double)val;
  val_local = (char *)data;
  data_local._4_4_ = type;
  if (type == Float || type == Double) {
    StringToNumber<double>(val,&local_28);
    SetAnyValueF(data_local._4_4_,(uint8_t *)val_local,local_28);
  }
  else {
    val_00 = StringToInt(val,10);
    SetAnyValueI(type,data,val_00);
  }
  return;
}

Assistant:

void SetAnyValueS(reflection::BaseType type, uint8_t *data, const char *val) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: {
      double d;
      StringToNumber(val, &d);
      SetAnyValueF(type, data, d);
      break;
    }
    // TODO: support strings.
    default: SetAnyValueI(type, data, StringToInt(val)); break;
  }
}